

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<QAccessibleInterface_*(*)(const_QString_&,_QObject_*)>::copyAppend
          (QPodArrayOps<QAccessibleInterface_*(*)(const_QString_&,_QObject_*)> *this,
          _func_QAccessibleInterface_ptr_QString_ptr_QObject_ptr **b,
          _func_QAccessibleInterface_ptr_QString_ptr_QObject_ptr **e)

{
  _func_QAccessibleInterface_ptr_QString_ptr_QObject_ptr **__dest;
  void *in_RDX;
  void *in_RSI;
  QArrayDataPointer<QAccessibleInterface_*(*)(const_QString_&,_QObject_*)> *in_RDI;
  
  if (in_RSI != in_RDX) {
    __dest = QArrayDataPointer<QAccessibleInterface_*(*)(const_QString_&,_QObject_*)>::end(in_RDI);
    memcpy(__dest,in_RSI,((long)in_RDX - (long)in_RSI >> 3) << 3);
    in_RDI->size = ((long)in_RDX - (long)in_RSI >> 3) + in_RDI->size;
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e) noexcept
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        ::memcpy(static_cast<void *>(this->end()), static_cast<const void *>(b), (e - b) * sizeof(T));
        this->size += (e - b);
    }